

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_delegated_credential_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  undefined1 local_38 [8];
  CBS sigalg_list;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((contents == (CBS *)0x0) ||
     (sigalg_list.len = (size_t)contents, uVar2 = ssl_protocol_version(hs->ssl), uVar2 < 0x304)) {
    return true;
  }
  iVar3 = CBS_get_u16_length_prefixed((CBS *)sigalg_list.len,(CBS *)local_38);
  if ((iVar3 != 0) &&
     (((sVar4 = CBS_len((CBS *)local_38), sVar4 != 0 &&
       (sVar4 = CBS_len((CBS *)sigalg_list.len), sVar4 == 0)) &&
      (bVar1 = parse_u16_array((CBS *)local_38,&hs->peer_delegated_credential_sigalgs), bVar1)))) {
    return true;
  }
  return false;
}

Assistant:

static bool ext_delegated_credential_parse_clienthello(SSL_HANDSHAKE *hs,
                                                       uint8_t *out_alert,
                                                       CBS *contents) {
  if (contents == nullptr || ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    // Don't use delegated credentials unless we're negotiating TLS 1.3 or
    // higher.
    return true;
  }

  // The contents of the extension are the signature algorithms the client will
  // accept for a delegated credential.
  CBS sigalg_list;
  if (!CBS_get_u16_length_prefixed(contents, &sigalg_list) ||  //
      CBS_len(&sigalg_list) == 0 ||                            //
      CBS_len(contents) != 0 ||                                //
      !parse_u16_array(&sigalg_list, &hs->peer_delegated_credential_sigalgs)) {
    return false;
  }

  return true;
}